

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O1

void __thiscall
QCryptographicHashPrivate::State::finalizeUnchecked(State *this,Algorithm method,HashResult *result)

{
  uchar *data;
  UWORD32 *in;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [12];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  uint uVar33;
  Sha3Variant sha3Variant;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  uint64_t uVar37;
  undefined8 *puVar38;
  undefined4 *puVar39;
  UWORD32 *__s;
  long lVar40;
  ulong uVar41;
  size_t sVar42;
  long in_FS_OFFSET;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint8_t buffer [64];
  undefined1 local_228 [36];
  uint32_t uStack_204;
  uint32_t uStack_200;
  undefined4 uStack_1fc;
  undefined1 local_1f8 [16];
  uint64_t local_1e8 [2];
  undefined1 local_1d8 [2];
  uchar uStack_1d6;
  uchar uStack_1d5;
  uint32_t uStack_1d4;
  undefined8 uStack_1d0;
  uint8_t local_1c8 [16];
  size_t local_1b8;
  ulong local_1b0;
  uchar local_1a8;
  ulong local_148;
  ulong local_140;
  uchar local_138;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(method) {
  case Md4:
    memcpy(local_228,this,0x98);
    uVar41 = (ulong)(local_228._0_4_ & 0x3f);
    data = local_228 + 0x18;
    lVar40 = uVar41 + 1;
    local_228[uVar41 + 0x18] = 0x80;
    uVar41 = uVar41 ^ 0x3f;
    if (uVar41 < 8) {
      memset(data + lVar40,0,uVar41);
      uVar41 = 0x40;
      body((md4_context *)local_228,data,0x40);
      lVar40 = 0;
    }
    memset(data + lVar40,0,uVar41 - 8);
    local_1d8[1] = (uchar)((uint)local_228._0_4_ >> 5);
    local_1d8[0] = (uchar)(local_228._0_4_ * 8);
    uStack_1d6 = (uchar)((uint)local_228._0_4_ >> 0xd);
    uStack_1d5 = (uchar)((uint)local_228._0_4_ >> 0x15);
    uStack_1d4 = local_228._4_4_;
    local_228._0_4_ = local_228._0_4_ * 8;
    body((md4_context *)local_228,data,0x40);
    *(undefined4 *)(result->m_data)._M_elems = local_228._8_4_;
    *(undefined4 *)((result->m_data)._M_elems + 4) = local_228._12_4_;
    *(undefined4 *)((result->m_data)._M_elems + 8) = local_228._16_4_;
    *(undefined4 *)((result->m_data)._M_elems + 0xc) = local_228._20_4_;
    memset(local_228,0,0x98);
    break;
  case Md5:
    puVar39 = (undefined4 *)local_228;
    for (lVar40 = 0x16; lVar40 != 0; lVar40 = lVar40 + -1) {
      *puVar39 = *(undefined4 *)this;
      this = this + 4;
      puVar39 = puVar39 + 1;
    }
    uVar35 = local_228._16_4_ & 0x3f;
    in = (UWORD32 *)(local_228 + 0x18);
    local_228[(ulong)uVar35 + 0x18] = 0x80;
    uVar33 = 0x37 - uVar35;
    __s = (UWORD32 *)(local_228 + (ulong)uVar35 + 0x19);
    if (0x37 < uVar35) {
      memset(local_228 + (ulong)uVar35 + 0x19,0,(ulong)(uVar35 ^ 0x3f));
      MD5Transform((UWORD32 *)local_228,in);
      uVar33 = 0x38;
      __s = in;
    }
    memset(__s,0,(ulong)uVar33);
    uStack_1d4 = local_228._20_4_ << 3 | (uint)local_228._16_4_ >> 0x1d;
    _local_1d8 = local_228._16_4_ * 8;
    MD5Transform((UWORD32 *)local_228,in);
    *(ulong *)(result->m_data)._M_elems = CONCAT44(local_228._4_4_,local_228._0_4_);
    *(ulong *)((result->m_data)._M_elems + 8) = CONCAT44(local_228._12_4_,local_228._8_4_);
    break;
  case Sha1:
    puVar38 = (undefined8 *)local_228;
    for (lVar40 = 0xc; lVar40 != 0; lVar40 = lVar40 + -1) {
      *puVar38 = *(undefined8 *)this;
      this = this + 8;
      puVar38 = puVar38 + 1;
    }
    uVar41 = local_228._24_8_ * 8;
    local_80 = uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
               (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
               (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 | (uVar41 & 0xff00) << 0x28
               | local_228._24_8_ << 0x3b;
    uVar33 = (uint)local_228._24_8_;
    uVar41 = (ulong)(uVar33 & 0x3f);
    local_228._24_8_ = local_228._24_8_ + 1;
    if (uVar41 == 0x3f) {
      memcpy(local_1d8 + 0xf,anon_var_dwarf_e9fb25,1);
      sha1ProcessChunk((Sha1State *)local_228,local_228 + 0x20);
      __memcpy_chk(local_228 + 0x20,anon_var_dwarf_e9fb25 + 1,0,0x40);
    }
    else {
      local_228[uVar41 + 0x20] = 0x80;
    }
    local_78 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    uVar33 = uVar33 & 0x3f;
    uVar41 = (ulong)((uint)local_228._24_8_ & 0x3f);
    if (uVar33 < 0x38) {
      uVar36 = (ulong)(0x37 - uVar33);
      local_228._24_8_ = local_228._24_8_ + uVar36;
      if (0x3f < uVar41 + uVar36) {
        sVar42 = 0x40 - uVar41;
        memcpy(local_228 + uVar41 + 0x20,local_78,sVar42);
        sha1ProcessChunk((Sha1State *)local_228,local_228 + 0x20);
        for (; (long)sVar42 < (long)(uVar36 - ((uint)(uVar41 + uVar36) & 0x3f));
            sVar42 = sVar42 + 0x40) {
          sha1ProcessChunk((Sha1State *)local_228,local_78 + sVar42);
        }
        lVar40 = uVar36 - sVar42;
        goto LAB_0035eb51;
      }
      memcpy(local_228 + uVar41 + 0x20,local_78,uVar36);
    }
    else {
      uVar36 = (ulong)(uVar33 ^ 0x3f);
      local_228._24_8_ = local_228._24_8_ + uVar36;
      if (uVar36 + uVar41 < 0x40) {
        memcpy(local_228 + uVar41 + 0x20,local_78,uVar36);
      }
      else {
        sVar42 = -uVar41 + 0x40;
        memcpy(local_228 + uVar41 + 0x20,local_78,sVar42);
        sha1ProcessChunk((Sha1State *)local_228,local_228 + 0x20);
        if ((long)sVar42 < (long)(uVar36 - ((uint)(uVar36 + uVar41) & 0x3f))) {
          sha1ProcessChunk((Sha1State *)local_228,(uchar *)((long)&local_38 + -uVar41));
          sVar42 = 0x80 - uVar41;
        }
        __memcpy_chk(local_228 + 0x20,local_78 + sVar42,uVar36 - sVar42,0x40);
      }
      uVar41 = (ulong)((uint)local_228._24_8_ & 0x3f);
      uVar37 = local_228._24_8_ + 0x38;
      local_228._24_8_ = uVar37;
      if (uVar41 < 8) {
        *(undefined8 *)(local_1d8 + uVar41) = local_48._0_8_;
        uVar28 = local_78._0_8_;
        uVar29 = local_78._8_8_;
        uVar30 = local_68._0_8_;
        uVar31 = local_68._8_8_;
        uVar32 = local_58._8_8_;
        *(undefined8 *)((long)local_1e8 + uVar41) = local_58._0_8_;
        *(undefined8 *)((long)local_1e8 + uVar41 + 8) = uVar32;
        *(undefined8 *)(local_1f8 + uVar41) = uVar30;
        *(undefined8 *)(local_1f8 + uVar41 + 8) = uVar31;
        *(undefined8 *)(local_228 + uVar41 + 0x20) = uVar28;
        *(undefined8 *)((long)&uStack_200 + uVar41) = uVar29;
      }
      else {
        sVar42 = -uVar41 + 0x40;
        memcpy(local_228 + uVar41 + 0x20,local_78,sVar42);
        sha1ProcessChunk((Sha1State *)local_228,local_228 + 0x20);
        if ((long)sVar42 < (long)(0x38 - (ulong)((uint)uVar37 & 0x3f))) {
          sha1ProcessChunk((Sha1State *)local_228,(uchar *)((long)&local_38 + -uVar41));
          sVar42 = 0x80 - uVar41;
        }
        lVar40 = 0x38 - sVar42;
LAB_0035eb51:
        __memcpy_chk(local_228 + 0x20,local_78 + sVar42,lVar40,0x40);
      }
    }
    uVar41 = (ulong)((uint)local_228._24_8_ & 0x3f);
    uVar37 = local_228._24_8_ + 8;
    if (uVar41 < 0x38) {
      *(ulong *)(local_228 + uVar41 + 0x20) = local_80;
    }
    else {
      sVar42 = -uVar41 + 0x40;
      local_228._24_8_ = uVar37;
      memcpy(local_228 + uVar41 + 0x20,&local_80,sVar42);
      sha1ProcessChunk((Sha1State *)local_228,local_228 + 0x20);
      if ((long)sVar42 < (long)(8 - (ulong)((uint)uVar37 & 0x3f))) {
        sha1ProcessChunk((Sha1State *)local_228,local_48 + -uVar41 + 8);
        sVar42 = 0x80 - uVar41;
      }
      __memcpy_chk(local_228 + 0x20,local_78 + (sVar42 - 8),8 - sVar42,0x40);
    }
    _local_1d8 = 0;
    uStack_1d0 = 0;
    local_1e8[0] = 0;
    local_1e8[1] = 0;
    local_1f8 = (undefined1  [16])0x0;
    stack0xfffffffffffffdf8 = (undefined1  [16])0x0;
    local_228._24_8_ = 0;
    auVar24._8_4_ = local_228._8_4_;
    auVar24._0_8_ = CONCAT44(local_228._4_4_,local_228._0_4_);
    auVar43._12_4_ = local_228._12_4_;
    auVar43._0_12_ = auVar24;
    auVar45[1] = 0;
    auVar45[0] = (byte)local_228._8_4_;
    auVar45[2] = SUB41(local_228._8_4_,1);
    auVar45[3] = 0;
    auVar45[4] = SUB41(local_228._8_4_,2);
    auVar45[5] = 0;
    auVar45[6] = SUB41(local_228._8_4_,3);
    auVar45[7] = 0;
    auVar45[8] = (uchar)local_228._12_4_;
    auVar45[9] = 0;
    auVar45[10] = SUB41(local_228._12_4_,1);
    auVar45[0xb] = 0;
    auVar45[0xc] = SUB41(local_228._12_4_,2);
    auVar45[0xd] = 0;
    auVar45[0xe] = SUB41(local_228._12_4_,3);
    auVar45[0xf] = 0;
    auVar44 = pshuflw(auVar45,auVar45,0x1b);
    auVar45 = pshufhw(auVar44,auVar44,0x1b);
    auVar17[0xd] = 0;
    auVar17._0_13_ = auVar43._0_13_;
    auVar17[0xe] = SUB41(local_228._4_4_,3);
    auVar18[0xc] = SUB41(local_228._4_4_,2);
    auVar18._0_12_ = auVar24;
    auVar18._13_2_ = auVar17._13_2_;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar24._0_11_;
    auVar19._12_3_ = auVar18._12_3_;
    auVar20[10] = SUB41(local_228._4_4_,1);
    auVar20._0_10_ = auVar24._0_10_;
    auVar20._11_4_ = auVar19._11_4_;
    auVar21[9] = 0;
    auVar21._0_9_ = auVar24._0_9_;
    auVar21._10_5_ = auVar20._10_5_;
    auVar22[8] = (uchar)local_228._4_4_;
    auVar22._0_8_ = CONCAT44(local_228._4_4_,local_228._0_4_);
    auVar22._9_6_ = auVar21._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar22._8_7_;
    auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
    auVar26[0] = SUB41(local_228._0_4_,3);
    auVar26._9_6_ = 0;
    auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
    auVar27[0] = SUB41(local_228._0_4_,2);
    auVar27._11_4_ = 0;
    auVar23[2] = SUB41(local_228._0_4_,1);
    auVar23._0_2_ = (ushort)local_228._0_4_;
    auVar23._3_12_ = SUB1512(auVar27 << 0x20,3);
    auVar44._0_2_ = (ushort)local_228._0_4_ & 0xff;
    auVar44._2_13_ = auVar23._2_13_;
    auVar44[0xf] = 0;
    auVar43 = pshuflw((undefined1  [16])0x0,auVar44,0x1b);
    auVar43 = pshufhw(auVar43,auVar43,0x1b);
    sVar1 = auVar43._0_2_;
    sVar2 = auVar43._2_2_;
    sVar3 = auVar43._4_2_;
    sVar4 = auVar43._6_2_;
    sVar5 = auVar43._8_2_;
    sVar6 = auVar43._10_2_;
    sVar7 = auVar43._12_2_;
    sVar8 = auVar43._14_2_;
    sVar9 = auVar45._0_2_;
    sVar10 = auVar45._2_2_;
    sVar11 = auVar45._4_2_;
    sVar12 = auVar45._6_2_;
    sVar13 = auVar45._8_2_;
    sVar14 = auVar45._10_2_;
    sVar15 = auVar45._12_2_;
    sVar16 = auVar45._14_2_;
    (result->m_data)._M_elems[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar43[0] - (0xff < sVar1);
    (result->m_data)._M_elems[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar43[2] - (0xff < sVar2);
    (result->m_data)._M_elems[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar43[4] - (0xff < sVar3);
    (result->m_data)._M_elems[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar43[6] - (0xff < sVar4);
    (result->m_data)._M_elems[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar43[8] - (0xff < sVar5);
    (result->m_data)._M_elems[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar43[10] - (0xff < sVar6);
    (result->m_data)._M_elems[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar43[0xc] - (0xff < sVar7);
    (result->m_data)._M_elems[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar43[0xe] - (0xff < sVar8);
    (result->m_data)._M_elems[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar45[0] - (0xff < sVar9);
    (result->m_data)._M_elems[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar45[2] - (0xff < sVar10);
    (result->m_data)._M_elems[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar45[4] - (0xff < sVar11);
    (result->m_data)._M_elems[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar45[6] - (0xff < sVar12);
    (result->m_data)._M_elems[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar45[8] - (0xff < sVar13);
    (result->m_data)._M_elems[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar45[10] - (0xff < sVar14)
    ;
    (result->m_data)._M_elems[0xe] =
         (0 < sVar15) * (sVar15 < 0x100) * auVar45[0xc] - (0xff < sVar15);
    (result->m_data)._M_elems[0xf] =
         (0 < sVar16) * (sVar16 < 0x100) * auVar45[0xe] - (0xff < sVar16);
    *(uint *)((result->m_data)._M_elems + 0x10) =
         (uint)local_228._16_4_ >> 0x18 | (local_228._16_4_ & 0xff0000) >> 8 |
         (local_228._16_4_ & 0xff00) << 8 | local_228._16_4_ << 0x18;
    break;
  case Sha224:
    puVar39 = (undefined4 *)local_228;
    for (lVar40 = 0x1d; lVar40 != 0; lVar40 = lVar40 + -1) {
      *puVar39 = *(undefined4 *)this;
      this = this + 4;
      puVar39 = puVar39 + 1;
    }
    iVar34 = 0x1c;
    goto LAB_0035e713;
  case Sha256:
    puVar39 = (undefined4 *)local_228;
    for (lVar40 = 0x1d; lVar40 != 0; lVar40 = lVar40 + -1) {
      *puVar39 = *(undefined4 *)this;
      this = this + 4;
      puVar39 = puVar39 + 1;
    }
    iVar34 = 0x20;
LAB_0035e713:
    SHA224_256ResultN((SHA256Context *)local_228,(uint8_t *)result,iVar34);
    break;
  case Sha384:
    memcpy(local_228,this,0xe0);
    iVar34 = 0x30;
    goto LAB_0035e8c5;
  case Sha512:
    memcpy(local_228,this,0xe0);
    iVar34 = 0x40;
LAB_0035e8c5:
    SHA384_512ResultN((SHA512Context *)local_228,(uint8_t *)result,iVar34);
    break;
  case Keccak_224:
  case Keccak_256:
  case Keccak_384:
  case Keccak_512:
    memcpy(local_228,this,0x1a0);
    sha3Variant = Keccak;
    goto LAB_0035e441;
  case RealSha3_224:
  case RealSha3_256:
  case RealSha3_384:
  case RealSha3_512:
    memcpy(local_228,this,0x1a0);
    sha3Variant = Sha3;
LAB_0035e441:
    sha3Finish((SHA3Context *)local_228,result,sha3Variant);
    break;
  case Blake2b_160:
  case Blake2b_256:
  case Blake2b_384:
  case Blake2b_512:
    uVar33 = hashLengthInternal(method);
    memcpy(local_228,this,0xf8);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    if ((local_140 <= uVar33) && (_local_1d8 == 0)) {
      local_1e8[1] = local_1e8[1] + CARRY8(local_1e8[0],local_148);
      local_1e8[0] = local_1e8[0] + local_148;
      if (local_138 != '\0') {
        uStack_1d0 = 0xffffffffffffffff;
      }
      _local_1d8 = 0xffffffffffffffff;
      lVar40 = 0;
      memset(local_1c8 + local_148,0,0x80 - local_148);
      blake2b_compress((blake2b_state *)local_228,local_1c8);
      do {
        *(undefined8 *)(local_78 + lVar40 * 8) = *(undefined8 *)(local_228 + lVar40 * 8);
        lVar40 = lVar40 + 1;
      } while (lVar40 != 8);
      memcpy(result,local_78,local_140);
      memset(local_78,0,0x40);
    }
    break;
  case Blake2s_128:
  case Blake2s_160:
  case Blake2s_224:
  case Blake2s_256:
    uVar33 = hashLengthInternal(method);
    memcpy(local_228,this,0x88);
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    if ((local_1b0 <= uVar33) && (uStack_200 == 0)) {
      uStack_204 = uStack_204 + CARRY4(local_228._32_4_,(uint)local_1b8);
      local_228._32_4_ = local_228._32_4_ + (uint)local_1b8;
      if (local_1a8 != '\0') {
        uStack_1fc = 0xffffffff;
      }
      uStack_200 = 0xffffffff;
      lVar40 = 0;
      memset(local_1f8 + local_1b8,0,0x40 - local_1b8);
      blake2s_compress((blake2s_state *)local_228,local_1f8);
      do {
        *(undefined4 *)(local_78 + lVar40 * 4) = *(undefined4 *)(local_228 + lVar40 * 4);
        lVar40 = lVar40 + 1;
      } while (lVar40 != 8);
      memcpy(result,local_78,(ulong)uVar33);
      memset(local_78,0,0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCryptographicHashPrivate::State::finalizeUnchecked(QCryptographicHash::Algorithm method,
                                                         HashResult &result) noexcept
{
    switch (method) {
    case QCryptographicHash::Sha1: {
        Sha1State copy = sha1Context;
        sha1FinalizeState(&copy);
        sha1ToHash(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md4: {
        md4_context copy = md4Context;
        md4_final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md5: {
        MD5Context copy = md5Context;
        MD5Final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha224: {
        SHA224Context copy = sha224Context;
        SHA224Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha256: {
        SHA256Context copy = sha256Context;
        SHA256Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha384: {
        SHA384Context copy = sha384Context;
        SHA384Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha512: {
        SHA512Context copy = sha512Context;
        SHA512Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::RealSha3_224:
    case QCryptographicHash::RealSha3_256:
    case QCryptographicHash::RealSha3_384:
    case QCryptographicHash::RealSha3_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Sha3);
        break;
    }
    case QCryptographicHash::Keccak_224:
    case QCryptographicHash::Keccak_256:
    case QCryptographicHash::Keccak_384:
    case QCryptographicHash::Keccak_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Keccak);
        break;
    }
    case QCryptographicHash::Blake2b_160:
    case QCryptographicHash::Blake2b_256:
    case QCryptographicHash::Blake2b_384:
    case QCryptographicHash::Blake2b_512: {
        const auto length = hashLengthInternal(method);
        blake2b_state copy = blake2bContext;
        blake2b_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::Blake2s_128:
    case QCryptographicHash::Blake2s_160:
    case QCryptographicHash::Blake2s_224:
    case QCryptographicHash::Blake2s_256: {
        const auto length = hashLengthInternal(method);
        blake2s_state copy = blake2sContext;
        blake2s_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::NumAlgorithms:
        Q_UNREACHABLE();
    }
}